

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O2

void __thiscall duckdb::MetaPipeline::Ready(MetaPipeline *this)

{
  pointer psVar1;
  pointer psVar2;
  Pipeline *this_00;
  MetaPipeline *this_01;
  shared_ptr<duckdb::Pipeline,_true> *pipeline;
  pointer this_02;
  pointer this_03;
  
  psVar1 = (this->pipelines).
           super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (this->pipelines).
                 super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                 .
                 super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != psVar1; this_02 = this_02 + 1
      ) {
    this_00 = shared_ptr<duckdb::Pipeline,_true>::operator->(this_02);
    Pipeline::Ready(this_00);
  }
  psVar2 = (this->children).
           super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_03 = (this->children).
                 super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
                 .
                 super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_03 != psVar2; this_03 = this_03 + 1
      ) {
    this_01 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(this_03);
    Ready(this_01);
  }
  return;
}

Assistant:

void MetaPipeline::Ready() const {
	for (auto &pipeline : pipelines) {
		pipeline->Ready();
	}
	for (auto &child : children) {
		child->Ready();
	}
}